

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

_Bool flatview_access_valid
                (uc_struct_conflict15 *uc,FlatView *fv,hwaddr addr,hwaddr len,_Bool is_write,
                MemTxAttrs attrs)

{
  long lVar1;
  _Bool _Var2;
  MemoryRegion_conflict *mr;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  hwaddr l;
  hwaddr xlat;
  hwaddr local_48;
  uc_struct_conflict15 *local_40;
  hwaddr local_38;
  
  bVar7 = len == 0;
  local_40 = uc;
  do {
    if (bVar7) {
      return bVar7;
    }
    local_48 = len;
    mr = flatview_translate_tricore(uc,fv,addr,&local_38,&local_48,is_write,attrs);
    bVar3 = mr->ram;
    if (is_write) {
      if ((_Bool)bVar3 != false) {
        bVar3 = mr->readonly ^ 1;
        goto LAB_00cf4b58;
      }
LAB_00cf4b5c:
      uVar4 = (mr->ops->valid).max_access_size;
      if (uVar4 == 0) {
        uVar4 = 4;
      }
      if ((mr->ops->impl).unaligned == false) {
        uVar5 = -(uint)addr & (uint)addr;
        uVar6 = uVar5;
        if (uVar4 < uVar5) {
          uVar6 = uVar4;
        }
        if (uVar5 != 0) {
          uVar4 = uVar6;
        }
      }
      if (uVar4 < (uint)local_48) {
        local_48._0_4_ = uVar4;
      }
      lVar1 = 0x3f;
      if ((uint)local_48 != 0) {
        for (; (uint)local_48 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      uVar4 = (uint)(0x8000000000000000 >> (~(byte)lVar1 & 0x3f));
      if ((uint)local_48 == 0) {
        uVar4 = 0;
      }
      local_48 = (hwaddr)(int)uVar4;
      uc = local_40;
      _Var2 = memory_region_access_valid_tricore(local_40,mr,local_38,uVar4,is_write,attrs);
      if (!_Var2) {
        return bVar7;
      }
    }
    else {
LAB_00cf4b58:
      if (bVar3 == 0) goto LAB_00cf4b5c;
    }
    addr = addr + local_48;
    len = len - local_48;
    bVar7 = len == 0;
  } while( true );
}

Assistant:

static bool flatview_access_valid(struct uc_struct *uc, FlatView *fv, hwaddr addr, hwaddr len,
                                  bool is_write, MemTxAttrs attrs)
{
    MemoryRegion *mr;
    hwaddr l, xlat;

    while (len > 0) {
        l = len;
        mr = flatview_translate(uc, fv, addr, &xlat, &l, is_write, attrs);
        if (!memory_access_is_direct(mr, is_write)) {
            l = memory_access_size(mr, l, addr);
            if (!memory_region_access_valid(uc, mr, xlat, l, is_write, attrs)) {
                return false;
            }
        }

        len -= l;
        addr += l;
    }
    return true;
}